

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangle.h
# Opt level: O2

void anurbs::Triangle<3L>::register_python(module *m)

{
  string name;
  class_<anurbs::Triangle<3L>_> local_80;
  _func_pair<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>_Matrix<double,_1,_3,_1,_1,_3>
  *local_78;
  char *local_70 [4];
  arg local_50;
  arg local_40;
  arg local_30;
  arg local_20;
  
  Triangle<3l>::python_name_abi_cxx11_();
  pybind11::class_<anurbs::Triangle<3L>_>::class_<>
            (&local_80,(m->super_object).super_handle.m_ptr,local_70[0]);
  local_78 = projection;
  local_20.name = "point";
  local_20._8_1_ = 2;
  local_30.name = "a";
  local_30._8_1_ = 2;
  local_40.name = "b";
  local_40._8_1_ = 2;
  local_50.name = "c";
  local_50._8_1_ = 2;
  pybind11::class_<anurbs::Triangle<3l>>::
  def_static<std::pair<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>(*)(Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::arg>
            ((class_<anurbs::Triangle<3l>> *)&local_80,"projection",&local_78,&local_20,&local_30,
             &local_40,&local_50);
  pybind11::object::~object((object *)&local_80);
  std::__cxx11::string::~string((string *)local_70);
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Triangle<TDimension>;

        const std::string name = Type::python_name();

        pybind11::class_<Type>(m, name.c_str())
            .def_static("projection", &Type::projection, "point"_a, "a"_a, "b"_a, "c"_a)
        ;
    }